

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obu_util.c
# Opt level: O0

aom_codec_err_t
aom_read_obu_header(uint8_t *buffer,size_t buffer_length,size_t *consumed,ObuHeader *header,
                   int is_annexb)

{
  undefined8 *in_RCX;
  undefined8 *in_RDX;
  long in_RSI;
  aom_read_bit_buffer *in_RDI;
  aom_codec_err_t parse_result;
  aom_read_bit_buffer rb;
  ObuHeader *in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffffa4;
  undefined4 local_4;
  
  if (((in_RSI == 0) || (in_RDX == (undefined8 *)0x0)) || (in_RCX == (undefined8 *)0x0)) {
    local_4 = AOM_CODEC_INVALID_PARAM;
  }
  else {
    local_4 = read_obu_header(in_RDI,in_stack_ffffffffffffffa4,in_stack_ffffffffffffff98);
    if (local_4 == AOM_CODEC_OK) {
      *in_RDX = *in_RCX;
    }
  }
  return local_4;
}

Assistant:

aom_codec_err_t aom_read_obu_header(uint8_t *buffer, size_t buffer_length,
                                    size_t *consumed, ObuHeader *header,
                                    int is_annexb) {
  if (buffer_length < 1 || !consumed || !header) return AOM_CODEC_INVALID_PARAM;

  // TODO(tomfinegan): Set the error handler here and throughout this file, and
  // confirm parsing work done via aom_read_bit_buffer is successful.
  struct aom_read_bit_buffer rb = { buffer, buffer + buffer_length, 0, NULL,
                                    NULL };
  aom_codec_err_t parse_result = read_obu_header(&rb, is_annexb, header);
  if (parse_result == AOM_CODEC_OK) *consumed = header->size;
  return parse_result;
}